

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::clearBufferiv
          (ReferenceContext *this,deUint32 buffer,int drawbuffer,int *value)

{
  bool bVar1;
  deUint32 stencil;
  InternalError *this_00;
  int s;
  int iVar2;
  byte bVar3;
  int y;
  int iVar4;
  int x_1;
  int x;
  int iVar5;
  int y_1;
  byte bVar6;
  IVec4 area_1;
  MultisamplePixelBufferAccess access;
  Vector<int,_4> local_b8;
  BVec4 *local_a8;
  IVec4 area;
  MultisamplePixelBufferAccess colorBuf;
  tcu local_40 [16];
  
  if ((buffer & 0xfffffffd) != 0x1800) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  if (drawbuffer != 0) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x501;
    return;
  }
  if (this->m_scissorEnabled == true) {
    tcu::Vector<int,_4>::Vector(&local_b8,&this->m_scissorBox);
  }
  else {
    local_b8.m_data[0] = 0;
    local_b8.m_data[1] = 0;
    local_b8.m_data[2] = 0x7fffffff;
    local_b8.m_data[3] = 0x7fffffff;
  }
  if (buffer == 0x1802) {
    getDrawStencilbuffer(&colorBuf,this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              ((MultisampleConstPixelBufferAccess *)&access,&colorBuf);
    area.m_data[0] = 0;
    area.m_data[1] = 0;
    intersect(&local_b8,&area);
    if (area_1.m_data[3] == 0 || area_1.m_data[2] == 0) {
      return;
    }
    if (this->m_stencil[0].writeMask == 0) {
      return;
    }
    rr::getSubregion((MultisamplePixelBufferAccess *)&area,&colorBuf,area_1.m_data[0],
                     area_1.m_data[1],area_1.m_data[2],area_1.m_data[3]);
    getStencilMultisampleAccess(&access,(MultisamplePixelBufferAccess *)&area);
    stencil = *value;
    for (iVar4 = 0; iVar4 < access.m_access.super_ConstPixelBufferAccess.m_size.m_data[2];
        iVar4 = iVar4 + 1) {
      for (iVar5 = 0; iVar5 < access.m_access.super_ConstPixelBufferAccess.m_size.m_data[1];
          iVar5 = iVar5 + 1) {
        for (iVar2 = 0; iVar2 < access.m_access.super_ConstPixelBufferAccess.m_size.m_data[0];
            iVar2 = iVar2 + 1) {
          writeMaskedStencil(&access,iVar2,iVar5,iVar4,stencil,this->m_stencil[0].writeMask);
        }
      }
    }
    return;
  }
  if (buffer != 0x1800) {
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this_00,(char *)0x0,"buffer == GL_STENCIL",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
               ,0xd78);
    __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  getDrawColorbuffer(&colorBuf,this);
  bVar1 = (this->m_colorMask).m_data[1];
  if ((this->m_colorMask).m_data[0] == true) {
    bVar3 = 1;
    if ((bVar1 != false) && ((this->m_colorMask).m_data[2] == true)) {
      bVar3 = (this->m_colorMask).m_data[3] ^ 1;
    }
  }
  else {
    bVar3 = 1;
    if ((bVar1 == false) && ((this->m_colorMask).m_data[2] == false)) {
      bVar6 = (this->m_colorMask).m_data[3] ^ 1;
      goto LAB_0048a01d;
    }
  }
  bVar6 = 0;
LAB_0048a01d:
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&access,&colorBuf);
  area_1.m_data[0] = 0;
  area_1.m_data[1] = 0;
  intersect(&local_b8,&area_1);
  if (((area.m_data[2] != 0) && (area.m_data[3] != 0)) && (bVar6 == 0)) {
    rr::getSubregion(&access,&colorBuf,area.m_data[0],area.m_data[1],area.m_data[2],area.m_data[3]);
    area_1.m_data._0_8_ = *(undefined8 *)value;
    area_1.m_data._8_8_ = *(undefined8 *)(value + 2);
    if (bVar3 == 0) {
      rr::clear(&access,&area_1);
    }
    else {
      local_a8 = &this->m_colorMask;
      for (iVar4 = 0; iVar4 < access.m_access.super_ConstPixelBufferAccess.m_size.m_data[2];
          iVar4 = iVar4 + 1) {
        for (iVar5 = 0; iVar5 < access.m_access.super_ConstPixelBufferAccess.m_size.m_data[1];
            iVar5 = iVar5 + 1) {
          for (iVar2 = 0; iVar2 < access.m_access.super_ConstPixelBufferAccess.m_size.m_data[0];
              iVar2 = iVar2 + 1) {
            tcu::ConstPixelBufferAccess::getPixelInt
                      ((ConstPixelBufferAccess *)&stack0xffffffffffffffb0,(int)&access,iVar2,iVar5);
            tcu::select<int,4>(local_40,&area_1,(Vector<int,_4> *)&stack0xffffffffffffffb0,local_a8)
            ;
            tcu::PixelBufferAccess::setPixel(&access.m_access,(IVec4 *)local_40,iVar2,iVar5,iVar4);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ReferenceContext::clearBufferiv (deUint32 buffer, int drawbuffer, const int* value)
{
	RC_IF_ERROR(buffer != GL_COLOR && buffer != GL_STENCIL, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(drawbuffer != 0, GL_INVALID_VALUE, RC_RET_VOID); // \todo [2012-04-06 pyry] MRT support.

	IVec4 baseArea = m_scissorEnabled ? m_scissorBox : IVec4(0, 0, 0x7fffffff, 0x7fffffff);

	if (buffer == GL_COLOR)
	{
		rr::MultisamplePixelBufferAccess	colorBuf	= getDrawColorbuffer();
		bool								maskUsed	= !m_colorMask[0] || !m_colorMask[1] || !m_colorMask[2] || !m_colorMask[3];
		bool								maskZero	= !m_colorMask[0] && !m_colorMask[1] && !m_colorMask[2] && !m_colorMask[3];
		IVec4								area		= intersect(baseArea, getBufferRect(colorBuf));

		if (!isEmpty(area) && !maskZero)
		{
			rr::MultisamplePixelBufferAccess	access		= rr::getSubregion(colorBuf, area.x(), area.y(), area.z(), area.w());
			IVec4								color		(value[0], value[1], value[2], value[3]);

			if (!maskUsed)
				rr::clear(access, color);
			else
			{
				for (int y = 0; y < access.raw().getDepth(); y++)
					for (int x = 0; x < access.raw().getHeight(); x++)
						for (int s = 0; s < access.getNumSamples(); s++)
							access.raw().setPixel(tcu::select(color, access.raw().getPixelInt(s, x, y), m_colorMask), s, x, y);
			}
		}
	}
	else
	{
		TCU_CHECK_INTERNAL(buffer == GL_STENCIL);

		rr::MultisamplePixelBufferAccess	stencilBuf	= getDrawStencilbuffer();
		IVec4								area		= intersect(baseArea, getBufferRect(stencilBuf));

		if (!isEmpty(area) && m_stencil[rr::FACETYPE_FRONT].writeMask != 0)
		{
			rr::MultisamplePixelBufferAccess	access		= getStencilMultisampleAccess(rr::getSubregion(stencilBuf, area.x(), area.y(), area.z(), area.w()));
			int									stencil		= value[0];

			for (int y = 0; y < access.raw().getDepth(); y++)
				for (int x = 0; x < access.raw().getHeight(); x++)
					for (int s = 0; s < access.getNumSamples(); s++)
						writeMaskedStencil(access, s, x, y, stencil, m_stencil[rr::FACETYPE_FRONT].writeMask);
		}
	}
}